

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::divideAndRoundUp(RangeValue *this,RangeValue *other)

{
  size_t sVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  size_t sVar3;
  undefined8 extraout_RAX_00;
  RangeValue RVar4;
  RangeValue RVar5;
  RangeValue *other_local;
  RangeValue *this_local;
  size_t local_10;
  
  if ((this->_isUnbound & 1U) == 0) {
    bVar2 = isUnbound(other);
    if (!bVar2) {
      if (this->_val == 0) {
        RangeValue((RangeValue *)&this_local,0);
        RVar4._val = local_10;
        RVar4._0_8_ = extraout_RAX;
      }
      else {
        sVar1 = this->_val;
        sVar3 = value(other);
        RangeValue((RangeValue *)&this_local,(sVar1 - 1) / sVar3 + 1);
        RVar4._val = local_10;
        RVar4._0_8_ = extraout_RAX_00;
      }
      goto LAB_00348131;
    }
  }
  RVar4 = operator/(this,other);
  this_local._0_1_ = RVar4._isUnbound;
LAB_00348131:
  local_10 = RVar4._val;
  RVar5._1_7_ = RVar4._1_7_;
  RVar5._isUnbound = (bool)this_local._0_1_;
  RVar5._val = local_10;
  return RVar5;
}

Assistant:

RangeValue RangeValue::divideAndRoundUp(const RangeValue& other) const {

    if (_isUnbound || other.isUnbound()) {
        return *this / other;
    }
    else if (_val == 0) {
        return RangeValue(0);
    }
    else {
        return ((_val - 1) / other.value()) + 1;
    }

}